

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O1

UTrie2 * utrie2_clone_63(UTrie2 *other,UErrorCode *pErrorCode)

{
  char cVar1;
  int iVar2;
  UNewTrie2 *__src;
  int32_t iVar3;
  UTrie2 *buffer;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  UTrie2 *pUVar7;
  UTrie2 *pUVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UTrie2 *)0x0;
  }
  if ((other == (UTrie2 *)0x0) ||
     ((other->memory == (void *)0x0 && (other->newTrie == (UNewTrie2 *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UTrie2 *)0x0;
  }
  buffer = (UTrie2 *)uprv_malloc_63(0x50);
  if (buffer == (UTrie2 *)0x0) {
    return (UTrie2 *)0x0;
  }
  pUVar7 = other;
  pUVar8 = buffer;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    pUVar8->index = pUVar7->index;
    pUVar7 = (UTrie2 *)((long)pUVar7 + (ulong)bVar9 * -0x10 + 8);
    pUVar8 = (UTrie2 *)((long)pUVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  if (other->memory == (void *)0x0) {
    __src = other->newTrie;
    pvVar4 = uprv_malloc_63(0x453c0);
    lVar6 = 0x48;
    if (pvVar4 != (void *)0x0) {
      pvVar5 = uprv_malloc_63((long)__src->dataCapacity << 2);
      *(void **)((long)pvVar4 + 0x23300) = pvVar5;
      if (pvVar5 != (void *)0x0) {
        *(int32_t *)((long)pvVar4 + 0x23314) = __src->dataCapacity;
        memcpy(pvVar4,__src,0x880);
        iVar2 = __src->index2Length;
        memcpy((void *)((long)pvVar4 + 0x880),__src->index2,(long)iVar2 << 2);
        *(int32_t *)((long)pvVar4 + 0x23320) = __src->index2NullOffset;
        *(int *)((long)pvVar4 + 0x23310) = iVar2;
        memcpy(*(void **)((long)pvVar4 + 0x23300),__src->data,(long)__src->dataLength << 2);
        *(int32_t *)((long)pvVar4 + 0x23324) = __src->dataNullOffset;
        iVar2 = __src->dataLength;
        *(int *)((long)pvVar4 + 0x23318) = iVar2;
        cVar1 = __src->isCompacted;
        iVar3 = 0;
        if (cVar1 == '\0') {
          memcpy((void *)((long)pvVar4 + 0x23330),__src->map,
                 (ulong)(long)iVar2 >> 3 & 0xfffffffffffffffc);
          iVar3 = __src->firstFreeBlock;
        }
        *(int32_t *)((long)pvVar4 + 0x2331c) = iVar3;
        *(uint32_t *)((long)pvVar4 + 0x23308) = __src->initialValue;
        *(uint32_t *)((long)pvVar4 + 0x2330c) = __src->errorValue;
        *(UChar32 *)((long)pvVar4 + 0x23328) = __src->highStart;
        *(char *)((long)pvVar4 + 0x2332c) = cVar1;
        goto LAB_002fabac;
      }
      uprv_free_63(pvVar4);
    }
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = uprv_malloc_63((long)other->length);
    buffer->memory = pvVar4;
    if (pvVar4 == (void *)0x0) goto LAB_002fabb0;
    buffer->isMemoryOwned = '\x01';
    pvVar5 = other->memory;
    memcpy(pvVar4,pvVar5,(long)other->length);
    buffer->index = (uint16_t *)(((long)other->index - (long)pvVar5) + (long)pvVar4);
    if (other->data16 != (uint16_t *)0x0) {
      buffer->data16 = (uint16_t *)(((long)other->data16 - (long)pvVar5) + (long)pvVar4);
    }
    if (other->data32 == (uint32_t *)0x0) goto LAB_002fabb0;
    pvVar4 = (void *)((long)pvVar4 + ((long)other->data32 - (long)pvVar5));
    lVar6 = 0x10;
  }
LAB_002fabac:
  *(void **)((long)&buffer->index + lVar6) = pvVar4;
LAB_002fabb0:
  if (buffer->memory != (void *)0x0) {
    return buffer;
  }
  if (buffer->newTrie == (UNewTrie2 *)0x0) {
    uprv_free_63(buffer);
    return (UTrie2 *)0x0;
  }
  return buffer;
}

Assistant:

U_CAPI void U_EXPORT2
utrie2_set32ForLeadSurrogateCodeUnit(UTrie2 *trie,
                                     UChar32 c, uint32_t value,
                                     UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return;
    }
    if(!U_IS_LEAD(c)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    set32(trie->newTrie, c, FALSE, value, pErrorCode);
}